

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Aig_Man_t * Saig_ManDupWithPhase(Aig_Man_t *pAig,Vec_Int_t *vInit)

{
  ulong uVar1;
  int iVar2;
  Aig_Man_t *p;
  char *pcVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int iVar7;
  
  if (pAig->nRegs <= vInit->nSize) {
    p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    pcVar3 = Abc_UtilStrsav(pAig->pName);
    p->pName = pcVar3;
    p->nConstrs = pAig->nConstrs;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    for (iVar7 = 0; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar7);
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar7);
      uVar1 = *(ulong *)((long)pvVar4 + 0x28);
      iVar2 = Vec_IntEntry(vInit,iVar7);
      *(ulong *)((long)pvVar4 + 0x28) = (long)iVar2 ^ uVar1;
    }
    for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    for (iVar7 = 0; iVar7 < pAig->nTruePos; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar7);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      Aig_ObjCreateCo(p,pAVar5);
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      iVar2 = Vec_IntEntry(vInit,iVar7);
      Aig_ObjCreateCo(p,(Aig_Obj_t *)((long)iVar2 ^ (ulong)pAVar5));
    }
    Aig_ManCleanup(p);
    Aig_ManSetRegNum(p,pAig->nRegs);
    return p;
  }
  __assert_fail("Aig_ManRegNum(pAig) <= Vec_IntSize(vInit)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigDup.c"
                ,0x1e5,"Aig_Man_t *Saig_ManDupWithPhase(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupWithPhase( Aig_Man_t * pAig, Vec_Int_t * vInit )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pAig) <= Vec_IntSize(vInit) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // update the flop variables
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pObj->pData, Vec_IntEntry(vInit, i) );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transfer to register outputs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // update the flop variables
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_NotCond(Aig_ObjChild0Copy(pObj), Vec_IntEntry(vInit, i)) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}